

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall
minihttp::HttpSocket::Download
          (HttpSocket *this,string *url,char *extraRequest,void *user,POST *post)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_108 [8];
  Request req;
  POST *post_local;
  void *user_local;
  char *extraRequest_local;
  string *url_local;
  HttpSocket *this_local;
  
  req.post.data.field_2._8_8_ = post;
  Request::Request((Request *)local_108);
  req._160_8_ = user;
  if (req.post.data.field_2._8_8_ != 0) {
    POST::operator=((POST *)&req.useSSL,(POST *)req.post.data.field_2._8_8_);
  }
  SplitURI(url,(string *)local_108,(string *)((long)&req.protocol.field_2 + 8),
           (string *)((long)&req.header.field_2 + 8),
           (int *)(req.extraGetHeaders.field_2._M_local_buf + 8),(bool *)&req.user);
  bVar1 = IsRedirecting(this);
  if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
    std::__cxx11::string::operator=
              ((string *)(req.protocol.field_2._M_local_buf + 8),(string *)&(this->_curRequest).host
              );
  }
  if ((int)req.extraGetHeaders.field_2._8_4_ < 0) {
    req.extraGetHeaders.field_2._8_4_ = 0x50;
  }
  if (extraRequest != (char *)0x0) {
    std::__cxx11::string::operator=((string *)(req.resource.field_2._M_local_buf + 8),extraRequest);
  }
  bVar1 = SendRequest(this,(Request *)local_108,false);
  Request::~Request((Request *)local_108);
  return bVar1;
}

Assistant:

bool HttpSocket::Download(const std::string& url, const char *extraRequest /*= NULL*/, void *user /* = NULL */, const POST *post /*= NULL*/)
{
    Request req;
    req.user = user;
    if(post)
        req.post = *post;
    SplitURI(url, req.protocol, req.host, req.resource, req.port, req.useSSL);
    if(IsRedirecting() && req.host.empty()) // if we're following a redirection to the same host, the server is likely to omit its hostname
        req.host = _curRequest.host;
    if(req.port < 0)
        req.port = 80;
    if(extraRequest)
        req.extraGetHeaders = extraRequest;
    return SendRequest(req, false);
}